

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

void ss_inplacemerge(sauchar_t *T,saidx64_t *PA,saidx64_t *first,saidx64_t *middle,saidx64_t *last,
                    saidx64_t depth)

{
  ulong uVar1;
  saidx64_t *middle_00;
  ulong *puVar2;
  ulong *in_RCX;
  ulong uVar3;
  ulong *puVar4;
  ulong *in_RDX;
  long in_RSI;
  sauchar_t *in_RDI;
  ulong *in_R8;
  saidx64_t in_R9;
  saint_t x;
  saint_t r;
  saint_t q;
  saidx64_t half;
  saidx64_t len;
  saidx64_t *b;
  saidx64_t *a;
  saidx64_t *p;
  ulong local_80;
  int iVar5;
  saint_t sVar6;
  saint_t in_stack_ffffffffffffffa4;
  saidx64_t *psVar7;
  saidx64_t *first_00;
  ulong *local_40;
  saidx64_t *local_38;
  ulong *local_28;
  ulong *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  do {
    uVar1 = local_28[-1];
    if (-1 < (long)uVar1) {
      uVar3 = local_28[-1];
    }
    else {
      uVar3 = local_28[-1] ^ 0xffffffffffffffff;
    }
    local_38 = (saidx64_t *)(in_RSI + uVar3 * 8);
    middle_00 = (saidx64_t *)((long)local_20 - (long)in_RDX >> 4);
    iVar5 = -1;
    first_00 = (saidx64_t *)((long)local_20 - (long)in_RDX >> 3);
    local_40 = in_RDX;
    while (0 < (long)first_00) {
      puVar2 = local_40 + (long)middle_00;
      if ((long)*puVar2 < 0) {
        local_80 = *puVar2 ^ 0xffffffffffffffff;
      }
      else {
        local_80 = *puVar2;
      }
      in_stack_ffffffffffffffa4 =
           ss_compare(in_RDI,(saidx64_t *)(in_RSI + local_80 * 8),local_38,in_R9);
      sVar6 = in_stack_ffffffffffffffa4;
      psVar7 = middle_00;
      if (in_stack_ffffffffffffffa4 < 0) {
        local_40 = puVar2 + 1;
        sVar6 = iVar5;
        psVar7 = (saidx64_t *)((long)middle_00 - ((ulong)first_00 & 1 ^ 1));
      }
      middle_00 = (saidx64_t *)((long)psVar7 >> 1);
      iVar5 = sVar6;
      first_00 = psVar7;
    }
    if (local_40 < local_20) {
      if (iVar5 == 0) {
        *local_40 = *local_40 ^ 0xffffffffffffffff;
      }
      ss_rotate(first_00,middle_00,(saidx64_t *)CONCAT44(in_stack_ffffffffffffffa4,iVar5));
      local_28 = local_28 + -((long)local_20 - (long)local_40 >> 3);
      local_20 = local_40;
      if (in_RDX == local_40) {
        return;
      }
    }
    local_28 = local_28 + -1;
    if (-1 >= (long)uVar1) {
      do {
        puVar4 = local_28 + -1;
        puVar2 = local_28 + -1;
        local_28 = puVar4;
      } while ((long)*puVar2 < 0);
    }
    if (local_20 == local_28) {
      return;
    }
  } while( true );
}

Assistant:

static
void
ss_inplacemerge(const sauchar_t *T, const saidx_t *PA,
                saidx_t *first, saidx_t *middle, saidx_t *last,
                saidx_t depth) {
  const saidx_t *p;
  saidx_t *a, *b;
  saidx_t len, half;
  saint_t q, r;
  saint_t x;

  for(;;) {
    if(*(last - 1) < 0) { x = 1; p = PA + ~*(last - 1); }
    else                { x = 0; p = PA +  *(last - 1); }
    for(a = first, len = middle - first, half = len >> 1, r = -1;
        0 < len;
        len = half, half >>= 1) {
      b = a + half;
      q = ss_compare(T, PA + ((0 <= *b) ? *b : ~*b), p, depth);
      if(q < 0) {
        a = b + 1;
        half -= (len & 1) ^ 1;
      } else {
        r = q;
      }
    }
    if(a < middle) {
      if(r == 0) { *a = ~*a; }
      ss_rotate(a, middle, last);
      last -= middle - a;
      middle = a;
      if(first == middle) { break; }
    }
    --last;
    if(x != 0) { while(*--last < 0) { } }
    if(middle == last) { break; }
  }
}